

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autograd.h
# Opt level: O2

void __thiscall yyml::nn::Autograd<double>::~Autograd(Autograd<double> *this)

{
  std::_Function_base::~_Function_base(&(this->backward_fn).super__Function_base);
  std::_Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::
  ~_Vector_base((_Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
                 *)this);
  return;
}

Assistant:

Autograd(std::vector<Autograd*> next, Variable<Type>* variable_ptr,
           BackwardFunction<Type> backward_fn)
      : next(next), variable_ptr(variable_ptr), backward_fn(backward_fn) {}